

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

ssize_t http2_handle_stream_close(connectdata *conn,Curl_easy *data,HTTP *stream,CURLcode *err)

{
  uint uVar1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  size_t sVar5;
  CURLcode result;
  size_t len;
  char *lf;
  char *trailp;
  http_conn *httpc;
  CURLcode *err_local;
  HTTP *stream_local;
  Curl_easy *data_local;
  connectdata *conn_local;
  
  if ((conn->proto).httpc.pause_stream_id == stream->stream_id) {
    (conn->proto).httpc.pause_stream_id = 0;
  }
  drained_transfer(data,&(conn->proto).httpc);
  if (((conn->proto).httpc.pause_stream_id == 0) &&
     (iVar2 = h2_process_pending_input(data,&(conn->proto).httpc,err), iVar2 != 0)) {
    conn_local = (connectdata *)0xffffffffffffffff;
  }
  else {
    stream->closed = false;
    if (stream->error == 7) {
      Curl_conncontrol(conn,1);
      *(uint *)&(data->state).field_0x6d0 = *(uint *)&(data->state).field_0x6d0 & 0xfffffffb | 4;
      *err = CURLE_RECV_ERROR;
      conn_local = (connectdata *)0xffffffffffffffff;
    }
    else if (stream->error == 0) {
      if ((stream->bodystarted & 1U) == 0) {
        Curl_failf(data,
                   "HTTP/2 stream %u was closed cleanly, but before getting  all response header fields, treated as error"
                   ,(ulong)(uint)stream->stream_id);
        *err = CURLE_HTTP2_STREAM;
        conn_local = (connectdata *)0xffffffffffffffff;
      }
      else {
        sVar5 = Curl_dyn_len(&stream->trailer_recvbuf);
        if (sVar5 != 0) {
          lf = Curl_dyn_ptr(&stream->trailer_recvbuf);
          do {
            pcVar4 = strchr(lf,10);
            if (pcVar4 == (char *)0x0) break;
            Curl_debug(data,CURLINFO_HEADER_IN,lf,(size_t)(pcVar4 + (1 - (long)lf)));
            CVar3 = Curl_client_write(data,2,lf,(size_t)(pcVar4 + (1 - (long)lf)));
            if (CVar3 != CURLE_OK) {
              *err = CVar3;
              return -1;
            }
            lf = pcVar4 + 1;
          } while (lf != (char *)0x0);
        }
        stream->close_handled = true;
        conn_local = (connectdata *)0x0;
      }
    }
    else {
      uVar1 = stream->stream_id;
      pcVar4 = nghttp2_http2_strerror(stream->error);
      Curl_failf(data,"HTTP/2 stream %u was not closed cleanly: %s (err %u)",(ulong)uVar1,pcVar4,
                 (ulong)stream->error);
      *err = CURLE_HTTP2_STREAM;
      conn_local = (connectdata *)0xffffffffffffffff;
    }
  }
  return (ssize_t)conn_local;
}

Assistant:

static ssize_t http2_handle_stream_close(struct connectdata *conn,
                                         struct Curl_easy *data,
                                         struct HTTP *stream, CURLcode *err)
{
  struct http_conn *httpc = &conn->proto.httpc;

  if(httpc->pause_stream_id == stream->stream_id) {
    httpc->pause_stream_id = 0;
  }

  drained_transfer(data, httpc);

  if(httpc->pause_stream_id == 0) {
    if(h2_process_pending_input(data, httpc, err) != 0) {
      return -1;
    }
  }

  DEBUGASSERT(data->state.drain == 0);

  /* Reset to FALSE to prevent infinite loop in readwrite_data function. */
  stream->closed = FALSE;
  if(stream->error == NGHTTP2_REFUSED_STREAM) {
    H2BUGF(infof(data, "REFUSED_STREAM (%u), try again on a new connection",
                 stream->stream_id));
    connclose(conn, "REFUSED_STREAM"); /* don't use this anymore */
    data->state.refused_stream = TRUE;
    *err = CURLE_RECV_ERROR; /* trigger Curl_retry_request() later */
    return -1;
  }
  else if(stream->error != NGHTTP2_NO_ERROR) {
    failf(data, "HTTP/2 stream %u was not closed cleanly: %s (err %u)",
          stream->stream_id, nghttp2_http2_strerror(stream->error),
          stream->error);
    *err = CURLE_HTTP2_STREAM;
    return -1;
  }

  if(!stream->bodystarted) {
    failf(data, "HTTP/2 stream %u was closed cleanly, but before getting "
          " all response header fields, treated as error",
          stream->stream_id);
    *err = CURLE_HTTP2_STREAM;
    return -1;
  }

  if(Curl_dyn_len(&stream->trailer_recvbuf)) {
    char *trailp = Curl_dyn_ptr(&stream->trailer_recvbuf);
    char *lf;

    do {
      size_t len = 0;
      CURLcode result;
      /* each trailer line ends with a newline */
      lf = strchr(trailp, '\n');
      if(!lf)
        break;
      len = lf + 1 - trailp;

      Curl_debug(data, CURLINFO_HEADER_IN, trailp, len);
      /* pass the trailers one by one to the callback */
      result = Curl_client_write(data, CLIENTWRITE_HEADER, trailp, len);
      if(result) {
        *err = result;
        return -1;
      }
      trailp = ++lf;
    } while(lf);
  }

  stream->close_handled = TRUE;

  H2BUGF(infof(data, "http2_recv returns 0, http2_handle_stream_close"));
  return 0;
}